

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.cpp
# Opt level: O1

void __thiscall FIX::message_order::message_order(message_order *this,int *order)

{
  int *piVar1;
  long lVar2;
  
  this->m_mode = group;
  *(undefined8 *)&this->m_delim = 0;
  *(undefined8 *)((long)&(this->m_groupOrder).m_size + 4) = 0;
  *(undefined8 *)((long)&(this->m_groupOrder).m_buffer + 4) = 0;
  lVar2 = 0;
  do {
    piVar1 = order + lVar2;
    lVar2 = lVar2 + 1;
  } while (*piVar1 != 0);
  setOrder(this,(int)lVar2 + -1,order);
  return;
}

Assistant:

message_order::message_order( const int order[] )
: m_mode( group ), m_delim( 0 ), m_largest( 0 )
{
  int size = 0;
  while( order[size] != 0 ) { ++size; }
  setOrder(size, order);
}